

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Vector<3> *
Omega_h::inertia::anon_unknown_0::get_center
          (Vector<3> *__return_storage_ptr__,CommPtr *comm,Reals *coords,Reals *masses,
          Real total_mass)

{
  int size_in;
  Write<double> local_168;
  Read<double> local_158;
  shared_ptr<Omega_h::Comm> local_148;
  Real local_138;
  Vector<3> result;
  type f;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  Write<double> weighted_coords;
  LO n;
  Real total_mass_local;
  Reals *masses_local;
  Reals *coords_local;
  CommPtr *comm_local;
  Real local_68;
  double local_60;
  double local_58;
  int local_4c;
  Real RStack_48;
  Int i;
  int local_3c;
  Vector<3> *local_38;
  int local_2c;
  Real *local_28;
  Reals *local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  weighted_coords.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 3);
  size_in = weighted_coords.shared_alloc_.direct_ptr._4_4_ * 3;
  local_20 = masses;
  local_18 = masses;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"",&local_d9);
  Write<double>::Write((Write<double> *)local_b8,size_in,(string *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  Write<double>::Write
            ((Write<double> *)(result.super_Few<double,_3>.array_ + 2),(Write<double> *)local_b8);
  Read<double>::Read((Read<double> *)&f.weighted_coords.shared_alloc_.direct_ptr,masses);
  Read<double>::Read((Read<double> *)&f.masses.write_.shared_alloc_.direct_ptr,coords);
  parallel_for<Omega_h::inertia::(anonymous_namespace)::get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::__0>
            (weighted_coords.shared_alloc_.direct_ptr._4_4_,
             (type *)(result.super_Few<double,_3>.array_ + 2),"get_center");
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_148,comm);
  Write<double>::Write(&local_168,(Write<double> *)local_b8);
  Read<double>::Read(&local_158,&local_168);
  repro_sum(&local_148,&local_158,3,&local_138);
  Read<double>::~Read(&local_158);
  Write<double>::~Write(&local_168);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_148);
  local_68 = local_138;
  local_60 = result.super_Few<double,_3>.array_[0];
  local_58 = result.super_Few<double,_3>.array_[1];
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_2c = local_4c;
    local_28 = &local_68;
    local_3c = local_4c;
    (__return_storage_ptr__->super_Few<double,_3>).array_[local_4c] =
         local_28[local_4c] / total_mass;
    local_38 = __return_storage_ptr__;
  }
  RStack_48 = total_mass;
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)(result.super_Few<double,_3>.array_ + 2));
  Write<double>::~Write((Write<double> *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Vector<3> get_center(
    CommPtr comm, Reals coords, Reals masses, Real total_mass) {
  auto n = masses.size();
  Write<Real> weighted_coords(n * 3);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<3>(weighted_coords, i, masses[i] * get_vector<3>(coords, i));
  };
  parallel_for(n, f, "get_center");
  Vector<3> result;
  repro_sum(comm, Reals(weighted_coords), 3, &result[0]);
  return result / total_mass;
}